

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,4u>::copyTo<ImageT<unsigned_int,3u>>
          (ImageT<unsigned_int,4u> *this,ImageT<unsigned_int,_3U> *dst,string_view swizzle)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t c;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  iVar3 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar4 = (**(code **)(*(long *)dst + 0x30))(dst);
  if (iVar3 != iVar4) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 3>]"
                 );
  }
  iVar3 = *(int *)(this + 8);
  if ((iVar3 != *(int *)(dst + 8)) || (iVar4 = *(int *)(this + 0xc), iVar4 != *(int *)(dst + 0xc)))
  {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 3>]"
                 );
  }
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(this + 0x10);
  lVar9 = 0;
  uVar6 = 0;
  do {
    if ((uint)(iVar4 * iVar3) <= uVar6) {
      return (ImageT<unsigned_int,_4U> *)this;
    }
    uVar7 = 0;
    lVar8 = lVar9;
    while( true ) {
      uVar5 = (**(code **)(*(long *)dst + 0x28))(dst);
      if (uVar5 <= uVar7) break;
      uVar5 = (**(code **)(*(long *)this + 0x28))(this);
      if (uVar5 <= uVar7) break;
      lVar1 = *(long *)(dst + 0x18);
      uVar5 = ImageT<unsigned_int,_4U>::swizzlePixel
                        ((ImageT<unsigned_int,_4U> *)this,
                         (Color *)(*(long *)(this + 0x18) + uVar6 * 0x10),swizzle._M_str[uVar7]);
      uVar2 = 2;
      if ((uint)uVar7 < 2) {
        uVar2 = uVar7;
      }
      *(uint *)(lVar1 + uVar6 * 0xc + (uVar2 & 0xffffffff) * 4) = uVar5;
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 4;
    }
    while( true ) {
      uVar5 = (**(code **)(*(long *)dst + 0x28))(dst);
      if (uVar5 <= uVar7) break;
      if (uVar7 < 3) {
        *(undefined4 *)(*(long *)(dst + 0x18) + lVar8) = 0;
      }
      else {
        *(undefined4 *)(*(long *)(dst + 0x18) + 8 + uVar6 * 0xc) = 0xffffffff;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 4;
    }
    uVar6 = uVar6 + 1;
    iVar3 = *(int *)(this + 8);
    iVar4 = *(int *)(this + 0xc);
    lVar9 = lVar9 + 0xc;
  } while( true );
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }